

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

AMPLS_MP_Solver *
AMPLS__internal__Open
          (unique_ptr<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> *p_be,CCallbacks cb)

{
  anon_class_24_3_3821feb3 fn;
  CCallbacks *__s;
  AMPLS_MP_Solver *in_RDI;
  AMPLS_MP_Solver *slv;
  
  __s = (CCallbacks *)operator_new(0x18);
  memset(__s,0,0x18);
  fn.p_be = (unique_ptr<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> *)&stack0x00000008
  ;
  fn.slv = (AMPLS_MP_Solver **)in_RDI;
  fn.cb = __s;
  AMPLS__internal__TryCatchWrapper<AMPLS__internal__Open(std::unique_ptr<mp::BasicBackend,std::default_delete<mp::BasicBackend>>,CCallbacks_T)::__0>
            (in_RDI,fn);
  return (AMPLS_MP_Solver *)__s;
}

Assistant:

AMPLS_MP_Solver* AMPLS__internal__Open(std::unique_ptr<mp::BasicBackend> p_be,
  CCallbacks cb = {}) {
  AMPLS_MP_Solver* slv = new AMPLS_MP_Solver();
  AMPLS__internal__TryCatchWrapper( slv, [&]() {
    auto ii = new AMPLS_MP__internal();
    slv->internal_info_ = ii;
    ii->p_be_ = std::move(p_be);
    auto be = ii->p_be_.get();
    be->GetCallbacks() = cb;
    be->set_output_handler(&ii->output_h_);
    char* argv[] = {(char*)"ampls-driver", nullptr};
    be->Init(argv);
    be->set_wantsol(1);       // user can still modify by 'wantsol=...'
    return 0;
  } );
  return slv;
}